

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O3

char * string_to_chars(http_string_t string)

{
  char *__dest;
  
  __dest = (char *)malloc(string.len + 1);
  if (__dest != (char *)0x0) {
    if (string.value != (char *)0x0) {
      strcpy(__dest,string.value);
    }
    __dest[string.len] = '\0';
    return __dest;
  }
  __assert_fail("result != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/unbyte[P]naive-httpserver/lib/server.c"
                ,0x1b0,"char *string_to_chars(http_string_t)");
}

Assistant:

char *string_to_chars(http_string_t string) {
    char *result = malloc(sizeof(char) * (string.len + 1));
    assert(result != NULL);
    if (string.value != NULL) strcpy(result, string.value);
    result[string.len] = '\0';
    return result;
}